

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Istream *this_00;
  pointer pFVar1;
  Result RVar2;
  Index IVar3;
  Offset offset;
  u32 val;
  Enum EVar4;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc_1;
  Location loc;
  Var local_c0;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&loc_1);
  RVar2 = SharedValidator::OnReturnCall(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    RVar2 = GetReturnCallDropKeepCount
                      (this,(this->func_types_).
                            super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                            ._M_impl.super__Vector_impl_data._M_start + func_index,0,&drop_count,
                       &keep_count);
    EVar4 = Error;
    if (RVar2.enum_ != Error) {
      RVar2 = TypeChecker::GetCatchCount
                        (&(this->validator_).typechecker_,
                         (int)((ulong)((long)(this->label_stack_).
                                             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->label_stack_).
                                            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                         &catch_drop_count);
      if (RVar2.enum_ != Error) {
        loc.field_1.field_0.last_column = 0;
        loc.filename._M_len = (this->filename_)._M_len;
        loc.filename._M_str = (this->filename_)._M_str;
        loc_1.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        loc_1.field_1.field_0.last_column = 0;
        loc_1.filename._M_len = (this->filename_)._M_len;
        loc_1.filename._M_str = (this->filename_)._M_str;
        loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
        Var::Var(&local_c0,func_index,&loc_1);
        RVar2 = SharedValidator::OnReturnCall(&this->validator_,&loc,&local_c0);
        Var::~Var(&local_c0);
        if (RVar2.enum_ != Error) {
          Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
          Istream::EmitCatchDrop(this->istream_,catch_drop_count);
          IVar3 = num_func_imports(this);
          if (func_index < IVar3) {
            Istream::Emit(this->istream_,InterpCallImport,func_index);
            Istream::Emit(this->istream_,Return);
          }
          else {
            Istream::Emit(this->istream_,InterpAdjustFrameForReturnCall,func_index);
            Istream::Emit(this->istream_,Br);
            this_00 = this->istream_;
            IVar3 = num_func_imports(this);
            if (func_index < IVar3) {
              __assert_fail("func_index >= num_func_imports()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                            ,0x1df,
                            "u32 wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetFuncOffset(Index)"
                           );
            }
            pFVar1 = (this->module_->funcs).
                     super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            val = pFVar1[func_index - IVar3].code_offset;
            if (val == 0xffffffff) {
              offset = Istream::end(this_00);
              FixupMap::Append(&this->func_fixups_,func_index,offset);
              val = pFVar1[func_index - IVar3].code_offset;
            }
            Istream::Emit(this_00,val);
          }
          EVar4 = Ok;
        }
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));

  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::InterpAdjustFrameForReturnCall, func_index);
    istream_.Emit(Opcode::Br);
    // We emit this separately to ensure that the fixup generated by
    // GetFuncOffset comes after the Br opcode.
    istream_.Emit(GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}